

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O0

bool __thiscall rtc::CriticalSection::IsLocked(CriticalSection *this)

{
  CriticalSection *this_local;
  
  return this->thread_ != 0;
}

Assistant:

bool CriticalSection::IsLocked() const {
#if defined(WEBRTC_WIN)
  return crit_.LockCount != -1;
#else
#if CS_DEBUG_CHECKS
  return thread_ != 0;
#else
  return true;
#endif
#endif
}